

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

void __thiscall cmNinjaNormalTargetGenerator::WriteLinkStatement(cmNinjaNormalTargetGenerator *this)

{
  pointer *rspfile_00;
  size_t *psVar1;
  cmOSXBundleGenerator *pcVar2;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *this_00;
  cmLocalCommonGenerator *pcVar3;
  bool bVar4;
  __type _Var5;
  TargetType targetType_00;
  int iVar6;
  TargetType TVar7;
  cmGeneratorTarget *this_01;
  string *psVar8;
  cmGeneratedFileStream *pcVar9;
  ostream *poVar10;
  char *pcVar11;
  reference ppcVar12;
  ulong uVar13;
  cmMakefile *this_02;
  mapped_type *pmVar14;
  cmGlobalNinjaGenerator *pcVar15;
  cmLocalNinjaGenerator *pcVar16;
  undefined4 extraout_var;
  pointer pcVar17;
  mapped_type *flags;
  mapped_type *linkFlags;
  cmGeneratorTarget *pcVar18;
  reference cc_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar19;
  const_iterator __first;
  const_iterator __last;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __result;
  MapToNinjaPathImpl __unary_op;
  ModuleDefinitionInfo *source_00;
  reference str1;
  reference ppcVar20;
  size_t sVar21;
  cmGlobalNinjaGenerator *this_03;
  bool local_1f42;
  byte local_1f01;
  cmOutputConverter *local_1b60;
  string local_1938;
  string local_1918;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18f1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_18f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_18d8;
  allocator<char> local_18b1;
  string local_18b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1890;
  allocator<char> local_1869;
  key_type local_1868;
  allocator<char> local_1841;
  key_type local_1840;
  string local_1820;
  undefined1 local_1800 [8];
  string soName;
  cmNinjaDeps symlinks;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_17a1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_17a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1788;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1769;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1768;
  allocator<char> local_1749;
  string local_1748;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1728;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1708;
  string local_16f0;
  string local_16d0;
  bool local_16a9;
  reference pbStack_16a8;
  bool usedResponseFile;
  string *o;
  iterator __end1;
  iterator __begin1;
  cmNinjaDeps *__range1;
  key_type local_1680;
  undefined1 local_1660 [8];
  cmNinjaDeps orderOnlyDeps;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1600;
  undefined1 local_15e0 [8];
  string rspfile;
  int local_15a0;
  int commandLineLengthLimit;
  bool lang_supports_response;
  cmGlobalNinjaGenerator *globalGen;
  key_type local_1588;
  allocator<char> local_1561;
  key_type local_1560;
  allocator<char> local_1539;
  key_type local_1538;
  byte local_1511;
  undefined1 local_1510 [7];
  bool symlinkNeeded;
  cmNinjaVars symlinkVars;
  string local_14d8;
  undefined1 local_14b8 [8];
  string postBuildCmdLine;
  key_type local_1490;
  allocator<char> local_1469;
  string local_1468;
  string local_1448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1428;
  undefined1 local_1408 [8];
  string homeOutDir;
  cmSourceFile *src;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__range2_2;
  string *obj;
  iterator __end3;
  iterator __begin3;
  cmNinjaDeps *__range3;
  cmNinjaDeps objs;
  cmGeneratedFileStream fout;
  undefined1 local_1128 [8];
  string obj_list_file;
  undefined1 local_10e8 [8];
  string cmd;
  string cmakeCommand;
  ModuleDefinitionInfo *mdi;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ccByproducts;
  undefined1 local_1050 [8];
  cmCustomCommandGenerator ccg;
  cmCustomCommand *cc;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *__range2_1;
  pointer *ppbStack_f98;
  uint i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *cmdLineLists [3];
  undefined1 local_f78 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  postBuildCmdLines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  preLinkCmdLines;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *cmdLists [3];
  char local_f22 [2];
  char *local_f20;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f18;
  allocator<char> local_f09;
  key_type local_f08;
  mapped_type *local_ee8;
  string *link_path;
  char *local_ed8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_ed0;
  allocator<char> local_ec1;
  key_type local_ec0;
  mapped_type *local_ea0;
  string *linkLibraries;
  key_type local_e90;
  string local_e70;
  string local_e50;
  undefined1 local_e30 [8];
  string objPath;
  key_type local_e08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_de8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dc8;
  allocator<char> local_da1;
  string local_da0;
  allocator<char> local_d79;
  string local_d78;
  allocator<char> local_d51;
  undefined1 local_d50 [8];
  string dbg_suffix;
  string local_d28;
  undefined1 local_d08 [8];
  string suffix;
  string base;
  string prefix;
  key_type local_ca0;
  undefined1 local_c80 [8];
  string impLibPath;
  cmNinjaDeps byproducts;
  key_type local_c40;
  string local_c20;
  undefined1 local_c00 [8];
  string install_dir;
  key_type local_bd8;
  allocator<char> local_bb1;
  key_type local_bb0;
  allocator<char> local_b89;
  key_type local_b88;
  allocator<char> local_b61;
  key_type local_b60;
  allocator<char> local_b39;
  key_type local_b38;
  undefined1 local_b18 [8];
  string t_1;
  key_type local_af0;
  allocator<char> local_ac9;
  key_type local_ac8;
  undefined1 local_aa8 [8];
  string t;
  string local_a80;
  string local_a60 [8];
  string lwyuFlags;
  key_type local_a38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a18;
  allocator<char> local_9f1;
  key_type local_9f0;
  string local_9d0;
  allocator<char> local_9a9;
  key_type local_9a8;
  allocator<char> local_981;
  key_type local_980;
  string local_960;
  allocator<char> local_939;
  key_type local_938;
  allocator<char> local_911;
  string local_910;
  allocator<char> local_8e9;
  key_type local_8e8;
  allocator<char> local_8c1;
  key_type local_8c0;
  allocator<char> local_899;
  key_type local_898;
  allocator<char> local_871;
  key_type local_870;
  allocator<char> local_849;
  key_type local_848;
  cmStateSnapshot local_828;
  cmStateDirectory local_810;
  unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_> local_7e8;
  unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_> linkLineComputer;
  key_type local_7d8;
  string local_7b8;
  cmLocalNinjaGenerator *local_798;
  cmLocalNinjaGenerator *localGen;
  byte local_769;
  undefined1 local_768 [7];
  bool useWatcomQuote;
  string createRule;
  string linkPath;
  string frameworkPath;
  cmMakefile *mf;
  cmNinjaDeps implicitDeps;
  cmNinjaDeps explicitDeps;
  key_type local_6c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  allocator<char> local_621;
  string local_620;
  char *local_600;
  char *partial;
  cmSourceFile *source;
  iterator __end2;
  iterator __begin2;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__range2;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> sources;
  string partials;
  cmLocalNinjaGenerator *localGen_1;
  key_type local_590;
  allocator<char> local_569;
  key_type local_568;
  allocator<char> local_541;
  key_type local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  allocator<char> local_4f9;
  key_type local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  allocator<char> local_4b1;
  key_type local_4b0;
  allocator<char> local_489;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  allocator<char> local_441;
  key_type local_440;
  allocator<char> local_419;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  allocator<char> local_3d1;
  string local_3d0;
  char *local_3b0;
  char *name;
  cmNinjaDeps outputs;
  ostringstream comment;
  undefined1 local_218 [8];
  cmNinjaVars vars;
  cmNinjaDeps emptyDeps;
  undefined1 local_1a8 [4];
  TargetType targetType;
  string local_188;
  string local_168;
  string local_148;
  undefined1 local_128 [8];
  string outpath;
  undefined1 local_e8 [8];
  string targetOutputImplib;
  undefined1 local_a8 [8];
  string targetOutputReal;
  string local_78;
  undefined1 local_58 [8];
  string targetOutput;
  string cfgName;
  cmGeneratorTarget *gt;
  cmNinjaNormalTargetGenerator *this_local;
  
  this_01 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  psVar8 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
  std::__cxx11::string::string((string *)(targetOutput.field_2._M_local_buf + 8),(string *)psVar8);
  cmGeneratorTarget::GetFullPath
            (&local_78,this_01,(string *)(targetOutput.field_2._M_local_buf + 8),
             RuntimeBinaryArtifact,false);
  cmNinjaTargetGenerator::ConvertToNinjaPath
            ((string *)local_58,&this->super_cmNinjaTargetGenerator,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  cmGeneratorTarget::GetFullPath
            ((string *)((long)&targetOutputImplib.field_2 + 8),this_01,
             (string *)((long)&targetOutput.field_2 + 8),RuntimeBinaryArtifact,true);
  cmNinjaTargetGenerator::ConvertToNinjaPath
            ((string *)local_a8,&this->super_cmNinjaTargetGenerator,
             (string *)((long)&targetOutputImplib.field_2 + 8));
  std::__cxx11::string::~string((string *)(targetOutputImplib.field_2._M_local_buf + 8));
  cmGeneratorTarget::GetFullPath
            ((string *)((long)&outpath.field_2 + 8),this_01,
             (string *)((long)&targetOutput.field_2 + 8),ImportLibraryArtifact,false);
  cmNinjaTargetGenerator::ConvertToNinjaPath
            ((string *)local_e8,&this->super_cmNinjaTargetGenerator,
             (string *)((long)&outpath.field_2 + 8));
  std::__cxx11::string::~string((string *)(outpath.field_2._M_local_buf + 8));
  bVar4 = cmGeneratorTarget::IsAppBundleOnApple(this_01);
  if (bVar4) {
    cmGeneratorTarget::GetDirectory
              ((string *)local_128,this_01,(string *)((long)&targetOutput.field_2 + 8),
               RuntimeBinaryArtifact);
    cmOSXBundleGenerator::CreateAppBundle
              ((this->super_cmNinjaTargetGenerator).OSXBundleGenerator,&(this->TargetNames).Output,
               (string *)local_128);
    std::__cxx11::string::operator=((string *)local_58,(string *)local_128);
    std::__cxx11::string::operator+=((string *)local_58,"/");
    std::__cxx11::string::operator+=((string *)local_58,(string *)&(this->TargetNames).Output);
    cmNinjaTargetGenerator::ConvertToNinjaPath
              (&local_148,&this->super_cmNinjaTargetGenerator,(string *)local_58);
    std::__cxx11::string::operator=((string *)local_58,(string *)&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::operator=((string *)local_a8,(string *)local_128);
    std::__cxx11::string::operator+=((string *)local_a8,"/");
    std::__cxx11::string::operator+=((string *)local_a8,(string *)&(this->TargetNames).Real);
    cmNinjaTargetGenerator::ConvertToNinjaPath
              (&local_168,&this->super_cmNinjaTargetGenerator,(string *)local_a8);
    std::__cxx11::string::operator=((string *)local_a8,(string *)&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)local_128);
  }
  else {
    bVar4 = cmGeneratorTarget::IsFrameworkOnApple(this_01);
    if (bVar4) {
      pcVar2 = (this->super_cmNinjaTargetGenerator).OSXBundleGenerator;
      cmGeneratorTarget::GetDirectory
                (&local_188,this_01,(string *)((long)&targetOutput.field_2 + 8),
                 RuntimeBinaryArtifact);
      cmOSXBundleGenerator::CreateFramework(pcVar2,&(this->TargetNames).Output,&local_188);
      std::__cxx11::string::~string((string *)&local_188);
    }
    else {
      bVar4 = cmGeneratorTarget::IsCFBundleOnApple(this_01);
      if (bVar4) {
        pcVar2 = (this->super_cmNinjaTargetGenerator).OSXBundleGenerator;
        cmGeneratorTarget::GetDirectory
                  ((string *)local_1a8,this_01,(string *)((long)&targetOutput.field_2 + 8),
                   RuntimeBinaryArtifact);
        cmOSXBundleGenerator::CreateCFBundle(pcVar2,&(this->TargetNames).Output,(string *)local_1a8)
        ;
        std::__cxx11::string::~string((string *)local_1a8);
      }
    }
  }
  pcVar9 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::WriteDivider((ostream *)pcVar9);
  targetType_00 = cmGeneratorTarget::GetType(this_01);
  pcVar9 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
  poVar10 = std::operator<<((ostream *)pcVar9,"# Link build statements for ");
  pcVar11 = cmState::GetTargetTypeName(targetType_00);
  poVar10 = std::operator<<(poVar10,pcVar11);
  poVar10 = std::operator<<(poVar10," target ");
  cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
            ((string *)
             &emptyDeps.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->super_cmNinjaTargetGenerator
            );
  poVar10 = std::operator<<(poVar10,(string *)
                                    &emptyDeps.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::operator<<(poVar10,"\n\n");
  std::__cxx11::string::~string
            ((string *)
             &emptyDeps.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_218);
  std::__cxx11::ostringstream::ostringstream
            ((ostringstream *)
             &outputs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  poVar10 = std::operator<<((ostream *)
                            &outputs.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,"Link the ");
  pcVar11 = GetVisibleTypeName(this);
  poVar10 = std::operator<<(poVar10,pcVar11);
  poVar10 = std::operator<<(poVar10," ");
  std::operator<<(poVar10,(string *)local_a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&name);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&name,(value_type *)local_a8);
  bVar4 = std::operator==(&this->TargetLinkLanguage,"Swift");
  if (bVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3d0,"SWIFT_MODULE_NAME",&local_3d1);
    pcVar11 = cmGeneratorTarget::GetProperty(this_01,&local_3d0);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::allocator<char>::~allocator(&local_3d1);
    local_3b0 = pcVar11;
    if (pcVar11 == (char *)0x0) {
      psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(this_01);
      std::operator+(&local_4d8,psVar8,".swiftdoc");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4f8,"TARGET_SWIFT_DOC",&local_4f9);
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_218,&local_4f8);
      std::__cxx11::string::operator=((string *)pmVar14,(string *)&local_4d8);
      std::__cxx11::string::~string((string *)&local_4f8);
      std::allocator<char>::~allocator(&local_4f9);
      std::__cxx11::string::~string((string *)&local_4d8);
      psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(this_01);
      std::operator+(&local_520,psVar8,".swiftmodule");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_540,"TARGET_SWIFT_MODULE",&local_541);
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_218,&local_540);
      std::__cxx11::string::operator=((string *)pmVar14,(string *)&local_520);
      std::__cxx11::string::~string((string *)&local_540);
      std::allocator<char>::~allocator(&local_541);
      std::__cxx11::string::~string((string *)&local_520);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,pcVar11,&local_419);
      std::operator+(&local_3f8,&local_418,".swiftdoc");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_440,"TARGET_SWIFT_DOC",&local_441);
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_218,&local_440);
      std::__cxx11::string::operator=((string *)pmVar14,(string *)&local_3f8);
      std::__cxx11::string::~string((string *)&local_440);
      std::allocator<char>::~allocator(&local_441);
      std::__cxx11::string::~string((string *)&local_3f8);
      std::__cxx11::string::~string((string *)&local_418);
      std::allocator<char>::~allocator(&local_419);
      pcVar11 = local_3b0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_488,pcVar11,&local_489);
      std::operator+(&local_468,&local_488,".swiftmodule");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4b0,"TARGET_SWIFT_MODULE",&local_4b1);
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_218,&local_4b0);
      std::__cxx11::string::operator=((string *)pmVar14,(string *)&local_468);
      std::__cxx11::string::~string((string *)&local_4b0);
      std::allocator<char>::~allocator(&local_4b1);
      std::__cxx11::string::~string((string *)&local_468);
      std::__cxx11::string::~string((string *)&local_488);
      std::allocator<char>::~allocator(&local_489);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_568,"TARGET_SWIFT_DOC",&local_569);
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_218,&local_568);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&name,pmVar14);
    std::__cxx11::string::~string((string *)&local_568);
    std::allocator<char>::~allocator(&local_569);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_590,"TARGET_SWIFT_MODULE",(allocator<char> *)((long)&localGen_1 + 7)
              );
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_218,&local_590);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&name,pmVar14);
    std::__cxx11::string::~string((string *)&local_590);
    std::allocator<char>::~allocator((allocator<char> *)((long)&localGen_1 + 7));
    pcVar16 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
    std::__cxx11::string::string
              ((string *)
               &sources.
                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
              ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&__range2);
    psVar8 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
    cmGeneratorTarget::GetObjectSources
              (this_01,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                       &__range2,psVar8);
    __end2 = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                       ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                        &__range2);
    source = (cmSourceFile *)
             std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                       ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                        &__range2);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                                       *)&source), bVar4) {
      ppcVar12 = __gnu_cxx::
                 __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                 ::operator*(&__end2);
      partial = (char *)*ppcVar12;
      std::__cxx11::string::operator+=
                ((string *)
                 &sources.
                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage," ");
      pcVar11 = partial;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_620,"SWIFT_PARTIAL_MODULE",&local_621);
      pcVar11 = cmSourceFile::GetProperty((cmSourceFile *)pcVar11,&local_620);
      std::__cxx11::string::~string((string *)&local_620);
      std::allocator<char>::~allocator(&local_621);
      local_600 = pcVar11;
      if (pcVar11 == (char *)0x0) {
        (*(pcVar16->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[0xc]
        )(&local_6a8,pcVar16,this_01);
        std::operator+(&local_688,&local_6a8,"/");
        psVar8 = cmGeneratorTarget::GetObjectName_abi_cxx11_(this_01,(cmSourceFile *)partial);
        std::operator+(&local_668,&local_688,psVar8);
        std::operator+(&local_648,&local_668,".swiftmodule");
        std::__cxx11::string::operator+=
                  ((string *)
                   &sources.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_648);
        std::__cxx11::string::~string((string *)&local_648);
        std::__cxx11::string::~string((string *)&local_668);
        std::__cxx11::string::~string((string *)&local_688);
        std::__cxx11::string::~string((string *)&local_6a8);
      }
      else {
        std::__cxx11::string::operator+=
                  ((string *)
                   &sources.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,pcVar11);
      }
      __gnu_cxx::
      __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
      ::operator++(&__end2);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6c8,"SWIFT_PARTIAL_MODULES",
               (allocator<char> *)
               ((long)&explicitDeps.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_218,&local_6c8);
    std::__cxx11::string::operator=
              ((string *)pmVar14,
               (string *)
               &sources.
                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_6c8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&explicitDeps.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
              ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&__range2);
    std::__cxx11::string::~string
              ((string *)
               &sources.
                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  cmNinjaTargetGenerator::GetObjects_abi_cxx11_
            ((cmNinjaDeps *)
             &implicitDeps.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->super_cmNinjaTargetGenerator
            );
  cmNinjaTargetGenerator::ComputeLinkDeps
            ((cmNinjaDeps *)&mf,&this->super_cmNinjaTargetGenerator,&this->TargetLinkLanguage);
  uVar13 = std::__cxx11::string::empty();
  if ((uVar13 & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&implicitDeps.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->DeviceLinkObject);
  }
  this_02 = cmNinjaTargetGenerator::GetMakefile(&this->super_cmNinjaTargetGenerator);
  std::__cxx11::string::string((string *)(linkPath.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(createRule.field_2._M_local_buf + 8));
  psVar8 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
  cmGeneratorTarget::GetCreateRuleVariable
            ((string *)local_768,this_01,&this->TargetLinkLanguage,psVar8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&localGen,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_768,
                 "_USE_WATCOM_QUOTE");
  bVar4 = cmMakefile::IsOn(this_02,(string *)&localGen);
  std::__cxx11::string::~string((string *)&localGen);
  local_769 = bVar4;
  local_798 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
  cmOutputConverter::ConvertToOutputFormat
            (&local_7b8,
             &(local_798->super_cmLocalCommonGenerator).super_cmLocalGenerator.
              super_cmOutputConverter,(string *)local_a8,SHELL);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7d8,"TARGET_FILE",
             (allocator<char> *)
             ((long)&linkLineComputer._M_t.
                     super___uniq_ptr_impl<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmLinkLineComputer_*,_std::default_delete<cmLinkLineComputer>_>
                     .super__Head_base<0UL,_cmLinkLineComputer_*,_false>._M_head_impl + 7));
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_218,&local_7d8);
  std::__cxx11::string::operator=((string *)pmVar14,(string *)&local_7b8);
  std::__cxx11::string::~string((string *)&local_7d8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&linkLineComputer._M_t.
                     super___uniq_ptr_impl<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmLinkLineComputer_*,_std::default_delete<cmLinkLineComputer>_>
                     .super__Head_base<0UL,_cmLinkLineComputer_*,_false>._M_head_impl + 7));
  std::__cxx11::string::~string((string *)&local_7b8);
  pcVar15 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  pcVar16 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
  local_1b60 = (cmOutputConverter *)0x0;
  if (pcVar16 != (cmLocalNinjaGenerator *)0x0) {
    local_1b60 = &(pcVar16->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter;
  }
  pcVar16 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
  cmLocalGenerator::GetStateSnapshot(&local_828,(cmLocalGenerator *)pcVar16);
  cmStateSnapshot::GetDirectory(&local_810,&local_828);
  iVar6 = (*(pcVar15->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
            [0xe])(pcVar15,local_1b60,&local_810);
  std::unique_ptr<cmLinkLineComputer,std::default_delete<cmLinkLineComputer>>::
  unique_ptr<std::default_delete<cmLinkLineComputer>,void>
            ((unique_ptr<cmLinkLineComputer,std::default_delete<cmLinkLineComputer>> *)&local_7e8,
             (pointer)CONCAT44(extraout_var,iVar6));
  pcVar17 = std::unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>::
            operator->(&local_7e8);
  cmLinkLineComputer::SetUseWatcomQuote(pcVar17,(bool)(local_769 & 1));
  pcVar16 = local_798;
  pcVar17 = std::unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>::get
                      (&local_7e8);
  psVar8 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_848,"LINK_LIBRARIES",&local_849);
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_218,&local_848);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_870,"FLAGS",&local_871);
  flags = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_218,&local_870);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_898,"LINK_FLAGS",&local_899);
  linkFlags = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_218,&local_898);
  cmLocalGenerator::GetTargetFlags
            ((cmLocalGenerator *)pcVar16,pcVar17,psVar8,pmVar14,flags,linkFlags,
             (string *)((long)&linkPath.field_2 + 8),(string *)((long)&createRule.field_2 + 8),
             this_01);
  std::__cxx11::string::~string((string *)&local_898);
  std::allocator<char>::~allocator(&local_899);
  std::__cxx11::string::~string((string *)&local_870);
  std::allocator<char>::~allocator(&local_871);
  std::__cxx11::string::~string((string *)&local_848);
  std::allocator<char>::~allocator(&local_849);
  TVar7 = cmGeneratorTarget::GetType
                    ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                     GeneratorTarget);
  if ((TVar7 == SHARED_LIBRARY) ||
     (TVar7 = cmGeneratorTarget::GetType
                        ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                         GeneratorTarget), TVar7 == MODULE_LIBRARY)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c0,"LINK_FLAGS",&local_8c1)
    ;
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_218,&local_8c0);
    cmCommonTargetGenerator::AppendOSXVerFlag
              ((cmCommonTargetGenerator *)this,pmVar14,&this->TargetLinkLanguage,"COMPATIBILITY",
               true);
    std::__cxx11::string::~string((string *)&local_8c0);
    std::allocator<char>::~allocator(&local_8c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_8e8,"LINK_FLAGS",&local_8e9)
    ;
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_218,&local_8e8);
    cmCommonTargetGenerator::AppendOSXVerFlag
              ((cmCommonTargetGenerator *)this,pmVar14,&this->TargetLinkLanguage,"CURRENT",false);
    std::__cxx11::string::~string((string *)&local_8e8);
    std::allocator<char>::~allocator(&local_8e9);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_910,"JOB_POOL_LINK",&local_911);
  cmNinjaTargetGenerator::addPoolNinjaVariable
            (&this->super_cmNinjaTargetGenerator,&local_910,this_01,(cmNinjaVars *)local_218);
  std::__cxx11::string::~string((string *)&local_910);
  std::allocator<char>::~allocator(&local_911);
  pcVar17 = std::unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>::get
                      (&local_7e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_938,"LINK_FLAGS",&local_939);
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_218,&local_938);
  cmCommonTargetGenerator::AddModuleDefinitionFlag((cmCommonTargetGenerator *)this,pcVar17,pmVar14);
  std::__cxx11::string::~string((string *)&local_938);
  std::allocator<char>::~allocator(&local_939);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_980,"LINK_FLAGS",&local_981);
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_218,&local_980);
  cmGlobalNinjaGenerator::EncodeLiteral(&local_960,pmVar14);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9a8,"LINK_FLAGS",&local_9a9);
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_218,&local_9a8);
  std::__cxx11::string::operator=((string *)pmVar14,(string *)&local_960);
  std::__cxx11::string::~string((string *)&local_9a8);
  std::allocator<char>::~allocator(&local_9a9);
  std::__cxx11::string::~string((string *)&local_960);
  std::__cxx11::string::~string((string *)&local_980);
  std::allocator<char>::~allocator(&local_981);
  cmCommonTargetGenerator::GetManifests_abi_cxx11_(&local_9d0,(cmCommonTargetGenerator *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9f0,"MANIFESTS",&local_9f1);
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_218,&local_9f0);
  std::__cxx11::string::operator=((string *)pmVar14,(string *)&local_9d0);
  std::__cxx11::string::~string((string *)&local_9f0);
  std::allocator<char>::~allocator(&local_9f1);
  std::__cxx11::string::~string((string *)&local_9d0);
  std::operator+(&local_a18,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&linkPath.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&createRule.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a38,"LINK_PATH",
             (allocator<char> *)(lwyuFlags.field_2._M_local_buf + 0xf));
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_218,&local_a38);
  std::__cxx11::string::operator=((string *)pmVar14,(string *)&local_a18);
  std::__cxx11::string::~string((string *)&local_a38);
  std::allocator<char>::~allocator((allocator<char> *)(lwyuFlags.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_a18);
  std::__cxx11::string::string(local_a60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a80,"LINK_WHAT_YOU_USE",
             (allocator<char> *)(t.field_2._M_local_buf + 0xf));
  bVar4 = cmGeneratorTarget::GetPropertyAsBool(this_01,&local_a80);
  std::__cxx11::string::~string((string *)&local_a80);
  std::allocator<char>::~allocator((allocator<char> *)(t.field_2._M_local_buf + 0xf));
  if (bVar4) {
    std::__cxx11::string::operator=(local_a60," -Wl,--no-as-needed");
  }
  if (targetType_00 == EXECUTABLE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_ac8,"FLAGS",&local_ac9);
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_218,&local_ac8);
    std::__cxx11::string::string((string *)local_aa8,(string *)pmVar14);
    std::__cxx11::string::~string((string *)&local_ac8);
    std::allocator<char>::~allocator(&local_ac9);
    cmLocalGenerator::AddArchitectureFlags
              ((cmLocalGenerator *)local_798,(string *)local_aa8,this_01,&this->TargetLinkLanguage,
               (string *)((long)&targetOutput.field_2 + 8));
    std::__cxx11::string::operator+=((string *)local_aa8,local_a60);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_af0,"FLAGS",(allocator<char> *)(t_1.field_2._M_local_buf + 0xf));
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_218,&local_af0);
    std::__cxx11::string::operator=((string *)pmVar14,(string *)local_aa8);
    std::__cxx11::string::~string((string *)&local_af0);
    std::allocator<char>::~allocator((allocator<char> *)(t_1.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)local_aa8);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b38,"ARCH_FLAGS",&local_b39)
    ;
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_218,&local_b38);
    std::__cxx11::string::string((string *)local_b18,(string *)pmVar14);
    std::__cxx11::string::~string((string *)&local_b38);
    std::allocator<char>::~allocator(&local_b39);
    cmLocalGenerator::AddArchitectureFlags
              ((cmLocalGenerator *)local_798,(string *)local_b18,this_01,&this->TargetLinkLanguage,
               (string *)((long)&targetOutput.field_2 + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b60,"ARCH_FLAGS",&local_b61)
    ;
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_218,&local_b60);
    std::__cxx11::string::operator=((string *)pmVar14,(string *)local_b18);
    std::__cxx11::string::~string((string *)&local_b60);
    std::allocator<char>::~allocator(&local_b61);
    std::__cxx11::string::clear();
    std::__cxx11::string::operator+=((string *)local_b18,local_a60);
    cmLocalGenerator::AddLanguageFlagsForLinking
              ((cmLocalGenerator *)local_798,(string *)local_b18,this_01,&this->TargetLinkLanguage,
               (string *)((long)&targetOutput.field_2 + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b88,"LANGUAGE_COMPILE_FLAGS",&local_b89);
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_218,&local_b88);
    std::__cxx11::string::operator=((string *)pmVar14,(string *)local_b18);
    std::__cxx11::string::~string((string *)&local_b88);
    std::allocator<char>::~allocator(&local_b89);
    std::__cxx11::string::~string((string *)local_b18);
  }
  pcVar18 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  bVar4 = cmGeneratorTarget::HasSOName(pcVar18,(string *)((long)&targetOutput.field_2 + 8));
  if (bVar4) {
    pcVar11 = cmMakefile::GetSONameFlag(this_02,&this->TargetLinkLanguage);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_bb0,"SONAME_FLAG",&local_bb1);
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_218,&local_bb0);
    std::__cxx11::string::operator=((string *)pmVar14,pcVar11);
    std::__cxx11::string::~string((string *)&local_bb0);
    std::allocator<char>::~allocator(&local_bb1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_bd8,"SONAME",
               (allocator<char> *)(install_dir.field_2._M_local_buf + 0xf));
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_218,&local_bd8);
    std::__cxx11::string::operator=((string *)pmVar14,(string *)&(this->TargetNames).SharedObject);
    std::__cxx11::string::~string((string *)&local_bd8);
    std::allocator<char>::~allocator((allocator<char> *)(install_dir.field_2._M_local_buf + 0xf));
    if (targetType_00 == SHARED_LIBRARY) {
      pcVar18 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
      cmGeneratorTarget::GetInstallNameDirForBuildTree
                ((string *)local_c00,pcVar18,(string *)((long)&targetOutput.field_2 + 8));
      uVar13 = std::__cxx11::string::empty();
      if ((uVar13 & 1) == 0) {
        cmOutputConverter::ConvertToOutputFormat
                  (&local_c20,
                   &(local_798->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,(string *)local_c00,SHELL);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c40,"INSTALLNAME_DIR",
                   (allocator<char> *)
                   ((long)&byproducts.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        pmVar14 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_218,&local_c40);
        std::__cxx11::string::operator=((string *)pmVar14,(string *)&local_c20);
        std::__cxx11::string::~string((string *)&local_c40);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&byproducts.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        std::__cxx11::string::~string((string *)&local_c20);
      }
      std::__cxx11::string::~string((string *)local_c00);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&impLibPath.field_2 + 8));
  uVar13 = std::__cxx11::string::empty();
  if ((uVar13 & 1) == 0) {
    cmOutputConverter::ConvertToOutputFormat
              ((string *)local_c80,
               &(local_798->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,(string *)local_e8,SHELL);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ca0,"TARGET_IMPLIB",
               (allocator<char> *)(prefix.field_2._M_local_buf + 0xf));
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_218,&local_ca0);
    std::__cxx11::string::operator=((string *)pmVar14,(string *)local_c80);
    std::__cxx11::string::~string((string *)&local_ca0);
    std::allocator<char>::~allocator((allocator<char> *)(prefix.field_2._M_local_buf + 0xf));
    cmNinjaTargetGenerator::EnsureParentDirectoryExists
              (&this->super_cmNinjaTargetGenerator,(string *)local_c80);
    bVar4 = cmGeneratorTarget::HasImportLibrary(this_01,(string *)((long)&targetOutput.field_2 + 8))
    ;
    if (bVar4) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&impLibPath.field_2 + 8),(value_type *)local_e8);
    }
    std::__cxx11::string::~string((string *)local_c80);
  }
  bVar4 = cmNinjaTargetGenerator::SetMsvcTargetPdbVariable
                    (&this->super_cmNinjaTargetGenerator,(cmNinjaVars *)local_218);
  if (!bVar4) {
    std::__cxx11::string::string((string *)(base.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(suffix.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_d08);
    pcVar18 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d28,"",(allocator<char> *)(dbg_suffix.field_2._M_local_buf + 0xf));
    cmGeneratorTarget::GetFullNameComponents
              (pcVar18,(string *)((long)&base.field_2 + 8),(string *)((long)&suffix.field_2 + 8),
               (string *)local_d08,&local_d28,RuntimeBinaryArtifact);
    std::__cxx11::string::~string((string *)&local_d28);
    std::allocator<char>::~allocator((allocator<char> *)(dbg_suffix.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_d50,".dbg",&local_d51);
    std::allocator<char>::~allocator(&local_d51);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d78,"CMAKE_DEBUG_SYMBOL_SUFFIX",&local_d79);
    pcVar11 = cmMakefile::GetDefinition(this_02,&local_d78);
    std::__cxx11::string::~string((string *)&local_d78);
    std::allocator<char>::~allocator(&local_d79);
    if (pcVar11 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_da0,"CMAKE_DEBUG_SYMBOL_SUFFIX",&local_da1);
      pcVar11 = cmMakefile::GetDefinition(this_02,&local_da0);
      std::__cxx11::string::operator=((string *)local_d50,pcVar11);
      std::__cxx11::string::~string((string *)&local_da0);
      std::allocator<char>::~allocator(&local_da1);
    }
    std::operator+(&local_de8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&suffix.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d08);
    std::operator+(&local_dc8,&local_de8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e08,"TARGET_PDB",
               (allocator<char> *)(objPath.field_2._M_local_buf + 0xf));
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_218,&local_e08);
    std::__cxx11::string::operator=((string *)pmVar14,(string *)&local_dc8);
    std::__cxx11::string::~string((string *)&local_e08);
    std::allocator<char>::~allocator((allocator<char> *)(objPath.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_dc8);
    std::__cxx11::string::~string((string *)&local_de8);
    std::__cxx11::string::~string((string *)local_d50);
    std::__cxx11::string::~string((string *)local_d08);
    std::__cxx11::string::~string((string *)(suffix.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(base.field_2._M_local_buf + 8));
  }
  pcVar18 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_((string *)local_e30,pcVar18);
  pcVar16 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
  cmNinjaTargetGenerator::ConvertToNinjaPath
            (&local_e70,&this->super_cmNinjaTargetGenerator,(string *)local_e30);
  cmOutputConverter::ConvertToOutputFormat
            (&local_e50,
             &(pcVar16->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter
             ,&local_e70,SHELL);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e90,"OBJECT_DIR",(allocator<char> *)((long)&linkLibraries + 7));
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_218,&local_e90);
  std::__cxx11::string::operator=((string *)pmVar14,(string *)&local_e50);
  std::__cxx11::string::~string((string *)&local_e90);
  std::allocator<char>::~allocator((allocator<char> *)((long)&linkLibraries + 7));
  std::__cxx11::string::~string((string *)&local_e50);
  std::__cxx11::string::~string((string *)&local_e70);
  cmNinjaTargetGenerator::EnsureDirectoryExists
            (&this->super_cmNinjaTargetGenerator,(string *)local_e30);
  pcVar15 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  bVar4 = cmGlobalNinjaGenerator::IsGCCOnWindows(pcVar15);
  if (bVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ec0,"LINK_LIBRARIES",&local_ec1);
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_218,&local_ec0);
    std::__cxx11::string::~string((string *)&local_ec0);
    std::allocator<char>::~allocator(&local_ec1);
    local_ea0 = pmVar14;
    local_ed0._M_current = (char *)std::__cxx11::string::begin();
    local_ed8 = (char *)std::__cxx11::string::end();
    link_path._7_1_ = 0x5c;
    link_path._6_1_ = 0x2f;
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (local_ed0,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )local_ed8,(char *)((long)&link_path + 7),(char *)((long)&link_path + 6));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f08,"LINK_PATH",&local_f09);
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_218,&local_f08);
    std::__cxx11::string::~string((string *)&local_f08);
    std::allocator<char>::~allocator(&local_f09);
    local_ee8 = pmVar14;
    local_f18._M_current = (char *)std::__cxx11::string::begin();
    local_f20 = (char *)std::__cxx11::string::end();
    local_f22[1] = 0x5c;
    local_f22[0] = '/';
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (local_f18,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )local_f20,local_f22 + 1,local_f22);
  }
  cmGeneratorTarget::GetPreBuildCommands(this_01);
  cmGeneratorTarget::GetPreLinkCommands(this_01);
  cmGeneratorTarget::GetPostBuildCommands(this_01);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&postBuildCmdLines.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_f78);
  ppbStack_f98 = &postBuildCmdLines.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
  cmdLineLists[0] =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)&postBuildCmdLines.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  cmdLineLists[1] =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)local_f78;
  for (__range2_1._4_4_ = 0; __range2_1._4_4_ != 3; __range2_1._4_4_ = __range2_1._4_4_ + 1) {
    this_00 = cmdLists[(ulong)__range2_1._4_4_ - 1];
    __end2_1 = std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::begin(this_00);
    cc = (cmCustomCommand *)
         std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::end(this_00);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<const_cmCustomCommand_*,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_>
                               *)&cc), bVar4) {
      cc_00 = __gnu_cxx::
              __normal_iterator<const_cmCustomCommand_*,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_>
              ::operator*(&__end2_1);
      ccg.WorkingDirectory.field_2._8_8_ = cc_00;
      std::__cxx11::string::string
                ((string *)&ccByproducts,(string *)(targetOutput.field_2._M_local_buf + 8));
      pcVar16 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
      cmCustomCommandGenerator::cmCustomCommandGenerator
                ((cmCustomCommandGenerator *)local_1050,cc_00,(string *)&ccByproducts,
                 (cmLocalGenerator *)pcVar16);
      std::__cxx11::string::~string((string *)&ccByproducts);
      cmLocalNinjaGenerator::AppendCustomCommandLines
                (local_798,(cmCustomCommandGenerator *)local_1050,
                 *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   **)(local_f78 + (ulong)__range2_1._4_4_ * 8 + -0x20));
      pvVar19 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_
                          ((cmCustomCommandGenerator *)local_1050);
      __first = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin(pvVar19);
      __last = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(pvVar19);
      __result = std::
                 back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                           ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)((long)&impLibPath.field_2 + 8));
      __unary_op = cmNinjaTargetGenerator::MapToNinjaPath(&this->super_cmNinjaTargetGenerator);
      std::
      transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
                ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )__first._M_current,
                 (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )__last._M_current,__result,__unary_op);
      cmCustomCommandGenerator::~cmCustomCommandGenerator((cmCustomCommandGenerator *)local_1050);
      __gnu_cxx::
      __normal_iterator<const_cmCustomCommand_*,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_>
      ::operator++(&__end2_1);
    }
  }
  psVar8 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
  source_00 = cmGeneratorTarget::GetModuleDefinitionInfo(this_01,psVar8);
  if ((source_00 != (ModuleDefinitionInfo *)0x0) && ((source_00->DefFileGenerated & 1U) != 0)) {
    pcVar16 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
    psVar8 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    cmOutputConverter::ConvertToOutputFormat
              ((string *)((long)&cmd.field_2 + 8),
               &(pcVar16->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,psVar8,SHELL);
    std::__cxx11::string::string((string *)local_10e8,(string *)(cmd.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)local_10e8," -E __create_def ");
    pcVar16 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
    cmOutputConverter::ConvertToOutputFormat
              ((string *)((long)&obj_list_file.field_2 + 8),
               &(pcVar16->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&source_00->DefFile,SHELL);
    std::__cxx11::string::operator+=
              ((string *)local_10e8,(string *)(obj_list_file.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(obj_list_file.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)local_10e8," ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128,
                   &source_00->DefFile,".objs");
    pcVar16 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
    cmOutputConverter::ConvertToOutputFormat
              ((string *)&fout.field_0x240,
               &(pcVar16->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,(string *)local_1128,SHELL);
    std::__cxx11::string::operator+=((string *)local_10e8,(string *)&fout.field_0x240);
    std::__cxx11::string::~string((string *)&fout.field_0x240);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&postBuildCmdLines.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_10e8);
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)
               &objs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_1128,false,None);
    if ((source_00->WindowsExportAllSymbols & 1U) != 0) {
      cmNinjaTargetGenerator::GetObjects_abi_cxx11_
                ((cmNinjaDeps *)&__range3,&this->super_cmNinjaTargetGenerator);
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range3);
      obj = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range3);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&obj), bVar4) {
        str1 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end3);
        bVar4 = cmHasLiteralSuffix<std::__cxx11::string,5ul>(str1,(char (*) [5])".obj");
        if (bVar4) {
          poVar10 = std::operator<<((ostream *)
                                    &objs.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    (string *)str1);
          std::operator<<(poVar10,"\n");
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range3);
    }
    __end2_2 = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                         (&source_00->Sources);
    src = (cmSourceFile *)
          std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                    (&source_00->Sources);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2_2,
                              (__normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                               *)&src), bVar4) {
      ppcVar20 = __gnu_cxx::
                 __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                 ::operator*(&__end2_2);
      homeOutDir.field_2._8_8_ = *ppcVar20;
      psVar8 = cmSourceFile::GetFullPath_abi_cxx11_((cmSourceFile *)homeOutDir.field_2._8_8_);
      poVar10 = std::operator<<((ostream *)
                                &objs.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)psVar8
                               );
      std::operator<<(poVar10,"\n");
      __gnu_cxx::
      __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
      ::operator++(&__end2_2);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream
              ((cmGeneratedFileStream *)
               &objs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)local_1128);
    std::__cxx11::string::~string((string *)local_10e8);
    std::__cxx11::string::~string((string *)(cmd.field_2._M_local_buf + 8));
  }
  bVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&postBuildCmdLines.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (!bVar4) {
    pcVar3 = &local_798->super_cmLocalCommonGenerator;
    psVar8 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)local_798);
    cmOutputConverter::ConvertToOutputFormat
              ((string *)local_1408,&(pcVar3->super_cmLocalGenerator).super_cmOutputConverter,psVar8
               ,SHELL);
    std::operator+(&local_1428,"cd ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1408);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&postBuildCmdLines.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1428);
    std::__cxx11::string::~string((string *)&local_1428);
    std::__cxx11::string::~string((string *)local_1408);
  }
  pcVar16 = local_798;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1468,"pre-link",&local_1469);
  cmLocalNinjaGenerator::BuildCommandLine
            (&local_1448,pcVar16,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&postBuildCmdLines.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1468,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1490,"PRE_LINK",
             (allocator<char> *)(postBuildCmdLine.field_2._M_local_buf + 0xf));
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_218,&local_1490);
  std::__cxx11::string::operator=((string *)pmVar14,(string *)&local_1448);
  std::__cxx11::string::~string((string *)&local_1490);
  std::allocator<char>::~allocator((allocator<char> *)(postBuildCmdLine.field_2._M_local_buf + 0xf))
  ;
  std::__cxx11::string::~string((string *)&local_1448);
  std::__cxx11::string::~string((string *)&local_1468);
  std::allocator<char>::~allocator(&local_1469);
  pcVar16 = local_798;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14d8,"post-build",
             (allocator<char> *)
             ((long)&symlinkVars._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  cmLocalNinjaGenerator::BuildCommandLine
            ((string *)local_14b8,pcVar16,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_f78,&local_14d8,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
  std::__cxx11::string::~string((string *)&local_14d8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&symlinkVars._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_1510);
  bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_a8);
  local_1f01 = 0;
  if (bVar4) {
    bVar4 = cmGeneratorTarget::IsFrameworkOnApple(this_01);
    local_1f01 = bVar4 ^ 0xff;
  }
  local_1511 = local_1f01 & 1;
  if (local_1511 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1538,"POST_BUILD",&local_1539);
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_218,&local_1538);
    std::__cxx11::string::operator=((string *)pmVar14,(string *)local_14b8);
    std::__cxx11::string::~string((string *)&local_1538);
    std::allocator<char>::~allocator(&local_1539);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1560,"POST_BUILD",&local_1561);
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_218,&local_1560);
    std::__cxx11::string::operator=
              ((string *)pmVar14,(string *)&cmGlobalNinjaGenerator::SHELL_NOOP_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1560);
    std::allocator<char>::~allocator(&local_1561);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1588,"POST_BUILD",(allocator<char> *)((long)&globalGen + 7));
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_1510,&local_1588);
    std::__cxx11::string::operator=((string *)pmVar14,(string *)local_14b8);
    std::__cxx11::string::~string((string *)&local_1588);
    std::allocator<char>::~allocator((allocator<char> *)((long)&globalGen + 7));
  }
  pcVar15 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  bVar4 = std::operator==(&this->TargetLinkLanguage,"RC");
  local_1f42 = true;
  if (!bVar4) {
    local_1f42 = std::operator==(&this->TargetLinkLanguage,"CUDA");
  }
  local_15a0 = -1;
  if ((((local_1f42 ^ 0xffU) & 1) == 0) ||
     (bVar4 = cmNinjaTargetGenerator::ForceResponseFile(&this->super_cmNinjaTargetGenerator), !bVar4
     )) {
    sVar21 = cmSystemTools::CalculateCommandLineLengthLimit();
    LanguageLinkerRule_abi_cxx11_((string *)((long)&rspfile.field_2 + 8),this);
    local_15a0 = cmGlobalNinjaGenerator::GetRuleCmdLength
                           (pcVar15,(string *)((long)&rspfile.field_2 + 8));
    local_15a0 = (int)sVar21 - local_15a0;
    std::__cxx11::string::~string((string *)(rspfile.field_2._M_local_buf + 8));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1640,"CMakeFiles/",
             (allocator<char> *)
             ((long)&orderOnlyDeps.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(this_01);
  std::operator+(&local_1620,&local_1640,psVar8);
  std::operator+(&local_1600,&local_1620,".rsp");
  cmNinjaTargetGenerator::ConvertToNinjaPath
            ((string *)local_15e0,&this->super_cmNinjaTargetGenerator,&local_1600);
  std::__cxx11::string::~string((string *)&local_1600);
  std::__cxx11::string::~string((string *)&local_1620);
  std::__cxx11::string::~string((string *)&local_1640);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&orderOnlyDeps.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_1660);
  pcVar16 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
  pcVar18 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  cmLocalNinjaGenerator::AppendTargetDepends
            (pcVar16,pcVar18,(cmNinjaDeps *)local_1660,DependOnTargetArtifact);
  bVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&impLibPath.field_2 + 8));
  pcVar11 = "1";
  if (bVar4) {
    pcVar11 = "";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1680,"RESTAT",(allocator<char> *)((long)&__range1 + 7));
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_218,&local_1680);
  std::__cxx11::string::operator=((string *)pmVar14,pcVar11);
  std::__cxx11::string::~string((string *)&local_1680);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  pvVar19 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&impLibPath.field_2 + 8);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(pvVar19);
  o = (string *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end(pvVar19);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&o), bVar4) {
    pbStack_16a8 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end1);
    this_03 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    cmGlobalNinjaGenerator::SeenCustomCommandOutput(this_03,pbStack_16a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&name,pbStack_16a8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  local_16a9 = false;
  pcVar9 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
  std::__cxx11::ostringstream::str();
  LanguageLinkerRule_abi_cxx11_(&local_16f0,this);
  local_1708.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1708.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1708.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1708);
  cmGlobalNinjaGenerator::WriteBuild
            (pcVar15,(ostream *)pcVar9,&local_16d0,&local_16f0,(cmNinjaDeps *)&name,&local_1708,
             (cmNinjaDeps *)
             &implicitDeps.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(cmNinjaDeps *)&mf,
             (cmNinjaDeps *)local_1660,(cmNinjaVars *)local_218,(string *)local_15e0,local_15a0,
             &local_16a9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1708);
  std::__cxx11::string::~string((string *)&local_16f0);
  std::__cxx11::string::~string((string *)&local_16d0);
  WriteLinkRule(this,(bool)(local_16a9 & 1));
  if ((local_1511 & 1) != 0) {
    if (targetType_00 == EXECUTABLE) {
      pcVar9 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
      std::operator+(&local_1728,"Create executable symlink ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1748,"CMAKE_SYMLINK_EXECUTABLE",&local_1749);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_1769);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_1768,1,(value_type *)local_58,&local_1769);
      local_1788.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1788.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1788.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_1788);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_17a1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_17a0,1,(value_type *)local_a8,&local_17a1);
      rspfile_00 = &symlinks.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::string((string *)rspfile_00);
      psVar1 = &vars._M_t._M_impl.super__Rb_tree_header._M_node_count;
      cmGlobalNinjaGenerator::WriteBuild
                (pcVar15,(ostream *)pcVar9,&local_1728,&local_1748,&local_1768,&local_1788,
                 &local_17a0,(cmNinjaDeps *)psVar1,(cmNinjaDeps *)psVar1,(cmNinjaVars *)local_1510,
                 (string *)rspfile_00,0,(bool *)0x0);
      std::__cxx11::string::~string
                ((string *)
                 &symlinks.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_17a0);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_17a1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1788);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1768);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_1769);
      std::__cxx11::string::~string((string *)&local_1748);
      std::allocator<char>::~allocator(&local_1749);
      std::__cxx11::string::~string((string *)&local_1728);
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&soName.field_2 + 8));
      cmNinjaTargetGenerator::GetTargetFilePath
                (&local_1820,&this->super_cmNinjaTargetGenerator,&(this->TargetNames).SharedObject);
      cmNinjaTargetGenerator::ConvertToNinjaPath
                ((string *)local_1800,&this->super_cmNinjaTargetGenerator,&local_1820);
      std::__cxx11::string::~string((string *)&local_1820);
      _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_1800);
      if ((_Var5) ||
         (_Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_58,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_1800), _Var5)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1840,"SONAME",&local_1841);
        pmVar14 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_1510,&local_1840);
        std::__cxx11::string::operator=((string *)pmVar14,(string *)local_1800);
        std::__cxx11::string::~string((string *)&local_1840);
        std::allocator<char>::~allocator(&local_1841);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1868,"SONAME",&local_1869);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_1510,&local_1868);
        std::__cxx11::string::clear();
        std::__cxx11::string::~string((string *)&local_1868);
        std::allocator<char>::~allocator(&local_1869);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&soName.field_2 + 8),(value_type *)local_1800);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&soName.field_2 + 8),(value_type *)local_58);
      pcVar9 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
      std::operator+(&local_1890,"Create library symlink ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_18b0,"CMAKE_SYMLINK_LIBRARY",&local_18b1);
      local_18d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_18d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_18d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_18d8);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_18f1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_18f0,1,(value_type *)local_a8,&local_18f1);
      std::__cxx11::string::string((string *)&local_1918);
      psVar1 = &vars._M_t._M_impl.super__Rb_tree_header._M_node_count;
      cmGlobalNinjaGenerator::WriteBuild
                (pcVar15,(ostream *)pcVar9,&local_1890,&local_18b0,
                 (cmNinjaDeps *)((long)&soName.field_2 + 8),&local_18d8,&local_18f0,
                 (cmNinjaDeps *)psVar1,(cmNinjaDeps *)psVar1,(cmNinjaVars *)local_1510,&local_1918,0
                 ,(bool *)0x0);
      std::__cxx11::string::~string((string *)&local_1918);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_18f0);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_18f1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_18d8);
      std::__cxx11::string::~string((string *)&local_18b0);
      std::allocator<char>::~allocator(&local_18b1);
      std::__cxx11::string::~string((string *)&local_1890);
      std::__cxx11::string::~string((string *)local_1800);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&soName.field_2 + 8));
    }
  }
  cmGlobalNinjaGenerator::AddTargetAlias(pcVar15,&(this->TargetNames).Output,this_01);
  cmNinjaTargetGenerator::GetTargetName_abi_cxx11_(&local_1938,&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::AddTargetAlias(pcVar15,&local_1938,this_01);
  std::__cxx11::string::~string((string *)&local_1938);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1660);
  std::__cxx11::string::~string((string *)local_15e0);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_1510);
  std::__cxx11::string::~string((string *)local_14b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_f78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&postBuildCmdLines.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_e30);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&impLibPath.field_2 + 8));
  std::__cxx11::string::~string(local_a60);
  std::unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>::~unique_ptr
            (&local_7e8);
  std::__cxx11::string::~string((string *)local_768);
  std::__cxx11::string::~string((string *)(createRule.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(linkPath.field_2._M_local_buf + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mf);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&implicitDeps.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&name);
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)
             &outputs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_218);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(targetOutput.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteLinkStatement()
{
  cmGeneratorTarget& gt = *this->GetGeneratorTarget();
  const std::string cfgName = this->GetConfigName();
  std::string targetOutput = ConvertToNinjaPath(gt.GetFullPath(cfgName));
  std::string targetOutputReal = ConvertToNinjaPath(
    gt.GetFullPath(cfgName, cmStateEnums::RuntimeBinaryArtifact,
                   /*realname=*/true));
  std::string targetOutputImplib = ConvertToNinjaPath(
    gt.GetFullPath(cfgName, cmStateEnums::ImportLibraryArtifact));

  if (gt.IsAppBundleOnApple()) {
    // Create the app bundle
    std::string outpath = gt.GetDirectory(cfgName);
    this->OSXBundleGenerator->CreateAppBundle(this->TargetNames.Output,
                                              outpath);

    // Calculate the output path
    targetOutput = outpath;
    targetOutput += "/";
    targetOutput += this->TargetNames.Output;
    targetOutput = this->ConvertToNinjaPath(targetOutput);
    targetOutputReal = outpath;
    targetOutputReal += "/";
    targetOutputReal += this->TargetNames.Real;
    targetOutputReal = this->ConvertToNinjaPath(targetOutputReal);
  } else if (gt.IsFrameworkOnApple()) {
    // Create the library framework.
    this->OSXBundleGenerator->CreateFramework(this->TargetNames.Output,
                                              gt.GetDirectory(cfgName));
  } else if (gt.IsCFBundleOnApple()) {
    // Create the core foundation bundle.
    this->OSXBundleGenerator->CreateCFBundle(this->TargetNames.Output,
                                             gt.GetDirectory(cfgName));
  }

  // Write comments.
  cmGlobalNinjaGenerator::WriteDivider(this->GetBuildFileStream());
  const cmStateEnums::TargetType targetType = gt.GetType();
  this->GetBuildFileStream()
    << "# Link build statements for " << cmState::GetTargetTypeName(targetType)
    << " target " << this->GetTargetName() << "\n\n";

  cmNinjaDeps emptyDeps;
  cmNinjaVars vars;

  // Compute the comment.
  std::ostringstream comment;
  comment << "Link the " << this->GetVisibleTypeName() << " "
          << targetOutputReal;

  // Compute outputs.
  cmNinjaDeps outputs;
  outputs.push_back(targetOutputReal);

  if (this->TargetLinkLanguage == "Swift") {
    if (const char* name = gt.GetProperty("SWIFT_MODULE_NAME")) {
      vars["TARGET_SWIFT_DOC"] = std::string(name) + ".swiftdoc";
      vars["TARGET_SWIFT_MODULE"] = std::string(name) + ".swiftmodule";
    } else {
      vars["TARGET_SWIFT_DOC"] = gt.GetName() + ".swiftdoc";
      vars["TARGET_SWIFT_MODULE"] = gt.GetName() + ".swiftmodule";
    }
    outputs.push_back(vars["TARGET_SWIFT_DOC"]);
    outputs.push_back(vars["TARGET_SWIFT_MODULE"]);

    cmLocalNinjaGenerator& localGen = *this->GetLocalGenerator();

    std::string partials;
    std::vector<cmSourceFile const*> sources;
    gt.GetObjectSources(sources, this->GetConfigName());
    for (cmSourceFile const* source : sources) {
      partials += " ";
      if (const char* partial = source->GetProperty("SWIFT_PARTIAL_MODULE")) {
        partials += partial;
      } else {
        partials += localGen.GetTargetDirectory(&gt) + "/" +
          gt.GetObjectName(source) + ".swiftmodule";
      }
    }
    vars["SWIFT_PARTIAL_MODULES"] = partials;
  }

  // Compute specific libraries to link with.
  cmNinjaDeps explicitDeps = this->GetObjects();
  cmNinjaDeps implicitDeps = this->ComputeLinkDeps(this->TargetLinkLanguage);

  if (!this->DeviceLinkObject.empty()) {
    explicitDeps.push_back(this->DeviceLinkObject);
  }

  cmMakefile* mf = this->GetMakefile();

  std::string frameworkPath;
  std::string linkPath;

  std::string createRule =
    gt.GetCreateRuleVariable(this->TargetLinkLanguage, this->GetConfigName());
  bool useWatcomQuote = mf->IsOn(createRule + "_USE_WATCOM_QUOTE");
  cmLocalNinjaGenerator& localGen = *this->GetLocalGenerator();

  vars["TARGET_FILE"] =
    localGen.ConvertToOutputFormat(targetOutputReal, cmOutputConverter::SHELL);

  std::unique_ptr<cmLinkLineComputer> linkLineComputer(
    this->GetGlobalGenerator()->CreateLinkLineComputer(
      this->GetLocalGenerator(),
      this->GetLocalGenerator()->GetStateSnapshot().GetDirectory()));
  linkLineComputer->SetUseWatcomQuote(useWatcomQuote);

  localGen.GetTargetFlags(linkLineComputer.get(), this->GetConfigName(),
                          vars["LINK_LIBRARIES"], vars["FLAGS"],
                          vars["LINK_FLAGS"], frameworkPath, linkPath, &gt);

  // Add OS X version flags, if any.
  if (this->GeneratorTarget->GetType() == cmStateEnums::SHARED_LIBRARY ||
      this->GeneratorTarget->GetType() == cmStateEnums::MODULE_LIBRARY) {
    this->AppendOSXVerFlag(vars["LINK_FLAGS"], this->TargetLinkLanguage,
                           "COMPATIBILITY", true);
    this->AppendOSXVerFlag(vars["LINK_FLAGS"], this->TargetLinkLanguage,
                           "CURRENT", false);
  }

  this->addPoolNinjaVariable("JOB_POOL_LINK", &gt, vars);

  this->AddModuleDefinitionFlag(linkLineComputer.get(), vars["LINK_FLAGS"]);
  vars["LINK_FLAGS"] =
    cmGlobalNinjaGenerator::EncodeLiteral(vars["LINK_FLAGS"]);

  vars["MANIFESTS"] = this->GetManifests();

  vars["LINK_PATH"] = frameworkPath + linkPath;
  std::string lwyuFlags;
  if (gt.GetPropertyAsBool("LINK_WHAT_YOU_USE")) {
    lwyuFlags = " -Wl,--no-as-needed";
  }

  // Compute architecture specific link flags.  Yes, these go into a different
  // variable for executables, probably due to a mistake made when duplicating
  // code between the Makefile executable and library generators.
  if (targetType == cmStateEnums::EXECUTABLE) {
    std::string t = vars["FLAGS"];
    localGen.AddArchitectureFlags(t, &gt, TargetLinkLanguage, cfgName);
    t += lwyuFlags;
    vars["FLAGS"] = t;
  } else {
    std::string t = vars["ARCH_FLAGS"];
    localGen.AddArchitectureFlags(t, &gt, TargetLinkLanguage, cfgName);
    vars["ARCH_FLAGS"] = t;
    t.clear();
    t += lwyuFlags;
    localGen.AddLanguageFlagsForLinking(t, &gt, TargetLinkLanguage, cfgName);
    vars["LANGUAGE_COMPILE_FLAGS"] = t;
  }
  if (this->GetGeneratorTarget()->HasSOName(cfgName)) {
    vars["SONAME_FLAG"] = mf->GetSONameFlag(this->TargetLinkLanguage);
    vars["SONAME"] = this->TargetNames.SharedObject;
    if (targetType == cmStateEnums::SHARED_LIBRARY) {
      std::string install_dir =
        this->GetGeneratorTarget()->GetInstallNameDirForBuildTree(cfgName);
      if (!install_dir.empty()) {
        vars["INSTALLNAME_DIR"] = localGen.ConvertToOutputFormat(
          install_dir, cmOutputConverter::SHELL);
      }
    }
  }

  cmNinjaDeps byproducts;

  if (!this->TargetNames.ImportLibrary.empty()) {
    const std::string impLibPath = localGen.ConvertToOutputFormat(
      targetOutputImplib, cmOutputConverter::SHELL);
    vars["TARGET_IMPLIB"] = impLibPath;
    EnsureParentDirectoryExists(impLibPath);
    if (gt.HasImportLibrary(cfgName)) {
      byproducts.push_back(targetOutputImplib);
    }
  }

  if (!this->SetMsvcTargetPdbVariable(vars)) {
    // It is common to place debug symbols at a specific place,
    // so we need a plain target name in the rule available.
    std::string prefix;
    std::string base;
    std::string suffix;
    this->GetGeneratorTarget()->GetFullNameComponents(prefix, base, suffix);
    std::string dbg_suffix = ".dbg";
    // TODO: Where to document?
    if (mf->GetDefinition("CMAKE_DEBUG_SYMBOL_SUFFIX")) {
      dbg_suffix = mf->GetDefinition("CMAKE_DEBUG_SYMBOL_SUFFIX");
    }
    vars["TARGET_PDB"] = base + suffix + dbg_suffix;
  }

  const std::string objPath = GetGeneratorTarget()->GetSupportDirectory();
  vars["OBJECT_DIR"] = this->GetLocalGenerator()->ConvertToOutputFormat(
    this->ConvertToNinjaPath(objPath), cmOutputConverter::SHELL);
  EnsureDirectoryExists(objPath);

  if (this->GetGlobalGenerator()->IsGCCOnWindows()) {
    // ar.exe can't handle backslashes in rsp files (implicitly used by gcc)
    std::string& linkLibraries = vars["LINK_LIBRARIES"];
    std::replace(linkLibraries.begin(), linkLibraries.end(), '\\', '/');
    std::string& link_path = vars["LINK_PATH"];
    std::replace(link_path.begin(), link_path.end(), '\\', '/');
  }

  const std::vector<cmCustomCommand>* cmdLists[3] = {
    &gt.GetPreBuildCommands(), &gt.GetPreLinkCommands(),
    &gt.GetPostBuildCommands()
  };

  std::vector<std::string> preLinkCmdLines, postBuildCmdLines;
  std::vector<std::string>* cmdLineLists[3] = { &preLinkCmdLines,
                                                &preLinkCmdLines,
                                                &postBuildCmdLines };

  for (unsigned i = 0; i != 3; ++i) {
    for (cmCustomCommand const& cc : *cmdLists[i]) {
      cmCustomCommandGenerator ccg(cc, cfgName, this->GetLocalGenerator());
      localGen.AppendCustomCommandLines(ccg, *cmdLineLists[i]);
      std::vector<std::string> const& ccByproducts = ccg.GetByproducts();
      std::transform(ccByproducts.begin(), ccByproducts.end(),
                     std::back_inserter(byproducts), MapToNinjaPath());
    }
  }

  // maybe create .def file from list of objects
  cmGeneratorTarget::ModuleDefinitionInfo const* mdi =
    gt.GetModuleDefinitionInfo(this->GetConfigName());
  if (mdi && mdi->DefFileGenerated) {
    std::string cmakeCommand =
      this->GetLocalGenerator()->ConvertToOutputFormat(
        cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
    std::string cmd = cmakeCommand;
    cmd += " -E __create_def ";
    cmd += this->GetLocalGenerator()->ConvertToOutputFormat(
      mdi->DefFile, cmOutputConverter::SHELL);
    cmd += " ";
    std::string obj_list_file = mdi->DefFile + ".objs";
    cmd += this->GetLocalGenerator()->ConvertToOutputFormat(
      obj_list_file, cmOutputConverter::SHELL);
    preLinkCmdLines.push_back(std::move(cmd));

    // create a list of obj files for the -E __create_def to read
    cmGeneratedFileStream fout(obj_list_file);

    if (mdi->WindowsExportAllSymbols) {
      cmNinjaDeps objs = this->GetObjects();
      for (std::string const& obj : objs) {
        if (cmHasLiteralSuffix(obj, ".obj")) {
          fout << obj << "\n";
        }
      }
    }

    for (cmSourceFile const* src : mdi->Sources) {
      fout << src->GetFullPath() << "\n";
    }
  }
  // If we have any PRE_LINK commands, we need to go back to CMAKE_BINARY_DIR
  // for
  // the link commands.
  if (!preLinkCmdLines.empty()) {
    const std::string homeOutDir = localGen.ConvertToOutputFormat(
      localGen.GetBinaryDirectory(), cmOutputConverter::SHELL);
    preLinkCmdLines.push_back("cd " + homeOutDir);
  }

  vars["PRE_LINK"] = localGen.BuildCommandLine(preLinkCmdLines, "pre-link",
                                               this->GeneratorTarget);
  std::string postBuildCmdLine = localGen.BuildCommandLine(
    postBuildCmdLines, "post-build", this->GeneratorTarget);

  cmNinjaVars symlinkVars;
  bool const symlinkNeeded =
    (targetOutput != targetOutputReal && !gt.IsFrameworkOnApple());
  if (!symlinkNeeded) {
    vars["POST_BUILD"] = postBuildCmdLine;
  } else {
    vars["POST_BUILD"] = cmGlobalNinjaGenerator::SHELL_NOOP;
    symlinkVars["POST_BUILD"] = postBuildCmdLine;
  }
  cmGlobalNinjaGenerator& globalGen = *this->GetGlobalGenerator();

  bool const lang_supports_response =
    !(this->TargetLinkLanguage == "RC" || this->TargetLinkLanguage == "CUDA");
  int commandLineLengthLimit = -1;
  if (!lang_supports_response || !this->ForceResponseFile()) {
    commandLineLengthLimit =
      static_cast<int>(cmSystemTools::CalculateCommandLineLengthLimit()) -
      globalGen.GetRuleCmdLength(this->LanguageLinkerRule());
  }

  const std::string rspfile = this->ConvertToNinjaPath(
    std::string("CMakeFiles/") + gt.GetName() + ".rsp");

  // Gather order-only dependencies.
  cmNinjaDeps orderOnlyDeps;
  this->GetLocalGenerator()->AppendTargetDepends(this->GetGeneratorTarget(),
                                                 orderOnlyDeps);

  // Ninja should restat after linking if and only if there are byproducts.
  vars["RESTAT"] = byproducts.empty() ? "" : "1";

  for (std::string const& o : byproducts) {
    this->GetGlobalGenerator()->SeenCustomCommandOutput(o);
    outputs.push_back(o);
  }

  // Write the build statement for this target.
  bool usedResponseFile = false;
  globalGen.WriteBuild(this->GetBuildFileStream(), comment.str(),
                       this->LanguageLinkerRule(), outputs,
                       /*implicitOuts=*/cmNinjaDeps(), explicitDeps,
                       implicitDeps, orderOnlyDeps, vars, rspfile,
                       commandLineLengthLimit, &usedResponseFile);
  this->WriteLinkRule(usedResponseFile);

  if (symlinkNeeded) {
    if (targetType == cmStateEnums::EXECUTABLE) {
      globalGen.WriteBuild(
        this->GetBuildFileStream(),
        "Create executable symlink " + targetOutput,
        "CMAKE_SYMLINK_EXECUTABLE", cmNinjaDeps(1, targetOutput),
        /*implicitOuts=*/cmNinjaDeps(), cmNinjaDeps(1, targetOutputReal),
        emptyDeps, emptyDeps, symlinkVars);
    } else {
      cmNinjaDeps symlinks;
      std::string const soName = this->ConvertToNinjaPath(
        this->GetTargetFilePath(this->TargetNames.SharedObject));
      // If one link has to be created.
      if (targetOutputReal == soName || targetOutput == soName) {
        symlinkVars["SONAME"] = soName;
      } else {
        symlinkVars["SONAME"].clear();
        symlinks.push_back(soName);
      }
      symlinks.push_back(targetOutput);
      globalGen.WriteBuild(
        this->GetBuildFileStream(), "Create library symlink " + targetOutput,
        "CMAKE_SYMLINK_LIBRARY", symlinks,
        /*implicitOuts=*/cmNinjaDeps(), cmNinjaDeps(1, targetOutputReal),
        emptyDeps, emptyDeps, symlinkVars);
    }
  }

  // Add aliases for the file name and the target name.
  globalGen.AddTargetAlias(this->TargetNames.Output, &gt);
  globalGen.AddTargetAlias(this->GetTargetName(), &gt);
}